

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_dict.c
# Opt level: O1

REF_STATUS ref_dict_bcast(REF_DICT ref_dict,REF_MPI ref_mpi)

{
  size_t __size;
  REF_INT n_00;
  uint uVar1;
  void *pvVar2;
  ulong uVar3;
  REF_INT RVar4;
  REF_INT RVar5;
  undefined8 uVar6;
  ulong uVar7;
  char *pcVar8;
  long lVar9;
  bool bVar10;
  REF_INT n;
  REF_INT local_44;
  void *local_40;
  void *local_38;
  
  uVar1 = 0;
  if (1 < ref_mpi->n) {
    if (ref_mpi->id == 0) {
      local_44 = ref_dict->n;
    }
    uVar1 = ref_mpi_bcast(ref_mpi,&local_44,1,1);
    n_00 = local_44;
    if (uVar1 == 0) {
      if ((long)local_44 < 0) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_dict.c",0xd7
               ,"ref_dict_bcast","malloc keys of REF_INT negative");
        uVar1 = 1;
      }
      else {
        __size = (long)local_44 * 4;
        pvVar2 = malloc(__size);
        if (pvVar2 == (void *)0x0) {
          pcVar8 = "malloc keys of REF_INT NULL";
          uVar6 = 0xd7;
        }
        else {
          local_40 = pvVar2;
          pvVar2 = malloc(__size);
          if (pvVar2 != (void *)0x0) {
            if (ref_mpi->id == 0) {
              uVar3 = (ulong)ref_dict->n;
              RVar5 = -1;
              if (0 < (long)uVar3) {
                RVar5 = *ref_dict->key;
              }
              if (0 < ref_dict->n) {
                RVar4 = *ref_dict->value;
                uVar7 = 1;
                do {
                  *(REF_INT *)((long)local_40 + uVar7 * 4 + -4) = RVar5;
                  *(REF_INT *)((long)pvVar2 + uVar7 * 4 + -4) = RVar4;
                  RVar4 = -1;
                  RVar5 = -1;
                  if (uVar7 < uVar3) {
                    RVar5 = ref_dict->key[uVar7];
                    RVar4 = ref_dict->value[uVar7];
                  }
                  bVar10 = uVar7 != uVar3;
                  uVar7 = uVar7 + 1;
                } while (bVar10);
              }
            }
            uVar1 = ref_mpi_bcast(ref_mpi,local_40,n_00,1);
            if (uVar1 == 0) {
              uVar1 = ref_mpi_bcast(ref_mpi,pvVar2,local_44,1);
              if (uVar1 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_dict.c"
                       ,0xe0,"ref_dict_bcast",(ulong)uVar1,"bcast values");
                return uVar1;
              }
              local_38 = pvVar2;
              if ((ref_mpi->id != 0) && (0 < local_44)) {
                lVar9 = 0;
                do {
                  uVar1 = ref_dict_store(ref_dict,*(REF_INT *)((long)local_40 + lVar9 * 4),
                                         *(REF_INT *)((long)local_38 + lVar9 * 4));
                  if (uVar1 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_dict.c"
                           ,0xe3,"ref_dict_bcast",(ulong)uVar1,"store");
                    return uVar1;
                  }
                  lVar9 = lVar9 + 1;
                } while (lVar9 < local_44);
              }
              free(local_38);
              free(local_40);
              return 0;
            }
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_dict.c",
                   0xdf,"ref_dict_bcast",(ulong)uVar1,"bcast keys");
            return uVar1;
          }
          pcVar8 = "malloc values of REF_INT NULL";
          uVar6 = 0xd8;
        }
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_dict.c",
               uVar6,"ref_dict_bcast",pcVar8);
        uVar1 = 2;
      }
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_dict.c",0xd6,
             "ref_dict_bcast",(ulong)uVar1,"bcast n");
    }
  }
  return uVar1;
}

Assistant:

REF_FCN REF_STATUS ref_dict_bcast(REF_DICT ref_dict, REF_MPI ref_mpi) {
  REF_INT n;
  REF_INT *keys, *values;
  REF_INT i, index, key, value;

  if (!ref_mpi_para(ref_mpi)) return REF_SUCCESS;

  if (ref_mpi_once(ref_mpi)) {
    n = ref_dict_n(ref_dict);
  }
  RSS(ref_mpi_bcast(ref_mpi, &n, 1, REF_INT_TYPE), "bcast n");
  ref_malloc(keys, n, REF_INT);
  ref_malloc(values, n, REF_INT);
  if (ref_mpi_once(ref_mpi)) {
    each_ref_dict_key_value(ref_dict, index, key, value) {
      keys[index] = key;
      values[index] = value;
    }
  }
  RSS(ref_mpi_bcast(ref_mpi, keys, n, REF_INT_TYPE), "bcast keys");
  RSS(ref_mpi_bcast(ref_mpi, values, n, REF_INT_TYPE), "bcast values");
  if (!ref_mpi_once(ref_mpi)) {
    for (i = 0; i < n; i++) {
      RSS(ref_dict_store(ref_dict, keys[i], values[i]), "store");
    }
  }
  ref_free(values);
  ref_free(keys);
  return REF_SUCCESS;
}